

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

Expr * nivalis::anon_unknown_3::wrap_expr(Expr *__return_storage_ptr__,uint32_t opcode,Expr *a)

{
  pointer pAVar1;
  size_t __n;
  
  Expr::Expr(__return_storage_ptr__);
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
            (&__return_storage_ptr__->ast,
             ((long)(a->ast).
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(a->ast).
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) + 1);
  pAVar1 = (__return_storage_ptr__->ast).
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1->opcode = opcode;
  (pAVar1->field_1).ref = 0xffffffffffffffff;
  pAVar1 = (a->ast).
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  __n = (long)(a->ast).
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pAVar1;
  if (__n != 0) {
    memmove((__return_storage_ptr__->ast).
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start + 1,pAVar1,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

Expr wrap_expr(uint32_t opcode, const Expr& a) {
    Expr new_expr;
    new_expr.ast.resize(a.ast.size() + 1);
    new_expr.ast[0] = opcode;
    std::copy(a.ast.begin(), a.ast.end(), new_expr.ast.begin() + 1);
    return new_expr;
}